

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall Input::Input(Input *this)

{
  long lVar1;
  
  for (lVar1 = -0x15c; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->keysUp[lVar1] = false;
    this->keysDown[lVar1] = false;
    this->mouse[lVar1] = false;
  }
  for (lVar1 = -7; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->mouseUp[lVar1] = false;
    this->mouseDown[lVar1] = false;
    this->mouseDown[lVar1 + 7] = false;
  }
  this->mouseX = 0.0;
  this->mouseY = 0.0;
  return;
}

Assistant:

Input::Input()
{
	for (unsigned int i = 0; i< GLFW_KEY_LAST; i++)
	{
		keys[i] = false;
		keysUp[i] = false;
		keysDown[i] = false;
	}
	for (unsigned int i = 0; i< GLFW_MOUSE_BUTTON_LAST; i++)
	{
		mouse[i] = false;
		mouseUp[i] = false;
		mouseDown[i] = false;
	}
	
	mouseX = 0;
	mouseY = 0;
}